

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

char * equip_describe(player *p,wchar_t slot)

{
  uint uVar1;
  wchar_t type;
  wchar_t slot_local;
  player *p_local;
  
  uVar1 = (uint)(p->body).slots[slot].type;
  if (((uVar1 == 1) && (((p->state).heavy_wield & 1U) != 0)) ||
     ((uVar1 == 1 && (((p->state).heavy_shoot & 1U) != 0)))) {
    p_local = (player *)slot_table[(int)uVar1].heavy_describe;
  }
  else if ((slot_table[(int)uVar1].name_in_desc & 1U) == 0) {
    p_local = (player *)slot_table[(int)uVar1].describe;
  }
  else {
    p_local = (player *)format(slot_table[(int)uVar1].describe,(p->body).slots[slot].name);
  }
  return (char *)p_local;
}

Assistant:

const char *equip_describe(struct player *p, int slot)
{
	int type = p->body.slots[slot].type;

	/* Heavy */
	if ((type == EQUIP_WEAPON && p->state.heavy_wield) ||
			(type == EQUIP_WEAPON && p->state.heavy_shoot))
		return slot_table[type].heavy_describe;
	else if (slot_table[type].name_in_desc)
		return format(slot_table[type].describe, p->body.slots[slot].name);
	else
		return slot_table[type].describe;
}